

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_move
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t destination,sysbvm_tuple_t value)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar3;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar4;
  
  if (destination != 0) {
    if ((*(uint *)(destination + 0x18) & 0xffff0) == 0x30) {
      sVar2 = sysbvm_array_create(context,2);
      if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
        *(sysbvm_tuple_t *)(sVar2 + 0x10) = destination;
        *(sysbvm_tuple_t *)(sVar2 + 0x18) = value;
      }
      psVar3 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
               sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerInstruction,9);
      psVar3[1].super.header.field_0.typePointer = 0x213;
      psVar3[1].super.header.identityHashAndFlags = (int)sVar2;
      psVar3[1].super.header.objectSize = (int)(sVar2 >> 0x20);
      psVar1 = assembler->lastInstruction;
      psVar3->previous = psVar1;
      ppsVar4 = &psVar1->next;
      if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
        ppsVar4 = &assembler->firstInstruction;
      }
      *ppsVar4 = psVar3;
      assembler->lastInstruction = psVar3;
      psVar3->sourceASTNode = assembler->sourceASTNode;
      psVar3->sourceEnvironment = assembler->sourceEnvironment;
      psVar3->sourcePosition = assembler->sourcePosition;
    }
    else {
      psVar3 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0;
    }
    return (sysbvm_tuple_t)psVar3;
  }
  return 0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_move(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t destination, sysbvm_tuple_t value)
{
    if(!sysbvm_functionBytecodeAssembler_isLocalVectorOperand(destination))
        return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_t operands = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(operands, 0, destination);
    sysbvm_array_atPut(operands, 1, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_MOVE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}